

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O3

void __thiscall HEVCStreamReader::HEVCStreamReader(HEVCStreamReader *this)

{
  HevcHdrUnit *this_00;
  HevcSliceHeader *this_01;
  
  MPEGStreamReader::MPEGStreamReader(&this->super_MPEGStreamReader);
  (this->super_MPEGStreamReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__HEVCStreamReader_0023d978;
  this->m_vps = (HevcVpsUnit *)0x0;
  this->m_sps = (HevcSpsUnit *)0x0;
  this->m_pps = (HevcPpsUnit *)0x0;
  this_00 = (HevcHdrUnit *)operator_new(0x40);
  HevcHdrUnit::HevcHdrUnit(this_00);
  this->m_hdr = this_00;
  this_01 = (HevcSliceHeader *)operator_new(0x48);
  HevcSliceHeader::HevcSliceHeader(this_01);
  this->m_slice = this_01;
  this->m_firstFrame = true;
  this->m_frameNum = 0;
  this->m_fullPicOrder = 0;
  this->m_picOrderBase = 0;
  this->m_frameDepth = 1;
  this->m_vpsCounter = 0;
  this->m_vpsSizeDiff = 0;
  this->m_picOrderMsb = 0;
  this->m_prevPicOrder = 0;
  this->m_lastIFrame = false;
  (this->m_vpsBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpsBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpsBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vpsBuffer).m_size = 0;
  (this->m_spsBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spsBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spsBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spsBuffer).m_size = 0;
  (this->m_ppsBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ppsBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ppsBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ppsBuffer).m_size = 0;
  this->m_firstFileFrame = false;
  return;
}

Assistant:

HEVCStreamReader::HEVCStreamReader()
    : m_vps(nullptr),
      m_sps(nullptr),
      m_pps(nullptr),
      m_hdr(new HevcHdrUnit()),
      m_slice(new HevcSliceHeader()),
      m_firstFrame(true),
      m_frameNum(0),
      m_fullPicOrder(0),
      m_picOrderBase(0),
      m_frameDepth(1),

      m_picOrderMsb(0),
      m_prevPicOrder(0),
      m_lastIFrame(false),
      m_firstFileFrame(false),
      m_vpsCounter(0),
      m_vpsSizeDiff(0)
{
}